

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_dwt_encode_v_func(void *user_data,opj_tls_t *tls)

{
  opj_dwt_encode_v_job_t *job;
  OPJ_UINT32 j;
  opj_tls_t *tls_local;
  void *user_data_local;
  
  for (job._4_4_ = *(uint *)((long)user_data + 0x28);
      job._4_4_ + 7 < *(uint *)((long)user_data + 0x2c); job._4_4_ = job._4_4_ + 8) {
    (**(code **)((long)user_data + 0x30))
              (*(long *)((long)user_data + 0x20) + (ulong)job._4_4_ * 4,*user_data,
               *(undefined4 *)((long)user_data + 0x18),*(int *)((long)user_data + 0x10) == 0,
               *(undefined4 *)((long)user_data + 0x1c),8);
  }
  if (job._4_4_ < *(uint *)((long)user_data + 0x2c)) {
    (**(code **)((long)user_data + 0x30))
              (*(long *)((long)user_data + 0x20) + (ulong)job._4_4_ * 4,*user_data,
               *(undefined4 *)((long)user_data + 0x18),*(int *)((long)user_data + 0x10) == 0,
               *(undefined4 *)((long)user_data + 0x1c),*(int *)((long)user_data + 0x2c) - job._4_4_)
    ;
  }
  opj_aligned_free(*user_data);
  opj_free(user_data);
  return;
}

Assistant:

static void opj_dwt_encode_v_func(void* user_data, opj_tls_t* tls)
{
    OPJ_UINT32 j;
    opj_dwt_encode_v_job_t* job;
    (void)tls;

    job = (opj_dwt_encode_v_job_t*)user_data;
    for (j = job->min_j; j + NB_ELTS_V8 - 1 < job->max_j; j += NB_ELTS_V8) {
        (*job->p_encode_and_deinterleave_v)(job->tiledp + j,
                                            job->v.mem,
                                            job->rh,
                                            job->v.cas == 0,
                                            job->w,
                                            NB_ELTS_V8);
    }
    if (j < job->max_j) {
        (*job->p_encode_and_deinterleave_v)(job->tiledp + j,
                                            job->v.mem,
                                            job->rh,
                                            job->v.cas == 0,
                                            job->w,
                                            job->max_j - j);
    }

    opj_aligned_free(job->v.mem);
    opj_free(job);
}